

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

shared_ptr<QPDFObject> * __thiscall QPDF::resolve(QPDF *this,QPDFObjGen og)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  element_type *peVar2;
  QPDFObjGen QVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  mapped_type *this_00;
  string *description;
  QPDFExc *__return_storage_ptr__;
  pair<std::_Rb_tree_iterator<QPDFObjGen>,_bool> pVar9;
  QPDFObjGen og_local;
  QPDFObjGen a_og;
  QPDFObjectHandle oh;
  string local_120;
  ResolveRecorder rr;
  allocator<char> local_e8 [32];
  undefined1 local_c8 [160];
  
  og_local = og;
  bVar4 = isUnresolved(this,og);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (bVar4) {
    sVar6 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                      (&(_Var1._M_head_impl)->resolving,&og_local);
    if (sVar6 == 0) {
      rr._vptr_ResolveRecorder = (_func_int **)&PTR__ResolveRecorder_002b0b68;
      rr.qpdf = this;
      pVar9 = std::
              _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
              ::_M_insert_unique<QPDFObjGen_const&>
                        ((_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                          *)&((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                             resolving,&og_local);
      rr.iter._M_node = (_Base_ptr)pVar9.first._M_node;
      sVar8 = std::
              map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::count(&((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table,
                      &og_local);
      if (sVar8 != 0) {
        this_00 = std::
                  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                  ::operator[](&((this->m)._M_t.
                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                 .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                xref_table,&og_local);
        iVar5 = QPDFXRefEntry::getType(this_00);
        if (iVar5 == 1) {
          description = (string *)QPDFXRefEntry::getOffset(this_00);
          a_og.obj = 0;
          a_og.gen = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_c8,"",(allocator<char> *)&local_120);
          readObjectAtOffset((QPDF *)&oh,SUB81(this,0),1,description,(QPDFObjGen)local_c8,
                             (QPDFObjGen *)og_local,SUB81(&a_og,0));
          std::__cxx11::string::~string((string *)local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        else {
          if (iVar5 != 2) {
            __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
            std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"",local_e8);
            QPDFObjGen::unparse_abi_cxx11_(&local_120,&og_local,'/');
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &a_og,"object ",&local_120);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oh,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &a_og," has unexpected xref entry type");
            damagedPDF(__return_storage_ptr__,this,(string *)local_c8,-1,(string *)&oh);
            __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
          iVar5 = QPDFXRefEntry::getObjStreamNumber(this_00);
          resolveObjectsInStream(this,iVar5);
        }
      }
      bVar4 = isUnresolved(this,og_local);
      QVar3 = og_local;
      if (bVar4) {
        QPDFObject::create<QPDF_Null>();
        updateCache(this,QVar3,(shared_ptr<QPDFObject> *)local_c8,-1,-1,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
      }
      pmVar7 = std::
               map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::operator[](&((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                             obj_cache,&og_local);
      peVar2 = (pmVar7->object).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2->qpdf = this;
      peVar2->og = og_local;
      ResolveRecorder::~ResolveRecorder(&rr);
      return &pmVar7->object;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&oh,"",local_e8);
    QPDFObjGen::unparse_abi_cxx11_(&local_120,&og_local,' ');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a_og,
                   "loop detected resolving object ",&local_120);
    damagedPDF((QPDFExc *)local_c8,this,(string *)&oh,(string *)&a_og);
    warn(this,(QPDFExc *)local_c8);
    QPDFExc::~QPDFExc((QPDFExc *)local_c8);
    std::__cxx11::string::~string((string *)&a_og);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&oh);
    QVar3 = og_local;
    QPDFObject::create<QPDF_Null>();
    updateCache(this,QVar3,(shared_ptr<QPDFObject> *)local_c8,-1,-1,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  }
  pmVar7 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::operator[](&(_Var1._M_head_impl)->obj_cache,&og_local);
  return &pmVar7->object;
}

Assistant:

std::shared_ptr<QPDFObject> const&
QPDF::resolve(QPDFObjGen og)
{
    if (!isUnresolved(og)) {
        return m->obj_cache[og].object;
    }

    if (m->resolving.count(og)) {
        // This can happen if an object references itself directly or indirectly in some key that
        // has to be resolved during object parsing, such as stream length.
        QTC::TC("qpdf", "QPDF recursion loop in resolve");
        warn(damagedPDF("", "loop detected resolving object " + og.unparse(' ')));
        updateCache(og, QPDFObject::create<QPDF_Null>(), -1, -1);
        return m->obj_cache[og].object;
    }
    ResolveRecorder rr(this, og);

    if (m->xref_table.count(og) != 0) {
        QPDFXRefEntry const& entry = m->xref_table[og];
        try {
            switch (entry.getType()) {
            case 1:
                {
                    qpdf_offset_t offset = entry.getOffset();
                    // Object stored in cache by readObjectAtOffset
                    QPDFObjGen a_og;
                    QPDFObjectHandle oh = readObjectAtOffset(true, offset, "", og, a_og, false);
                }
                break;

            case 2:
                resolveObjectsInStream(entry.getObjStreamNumber());
                break;

            default:
                throw damagedPDF(
                    "", -1, ("object " + og.unparse('/') + " has unexpected xref entry type"));
            }
        } catch (QPDFExc& e) {
            warn(e);
        } catch (std::exception& e) {
            warn(damagedPDF(
                "", -1, ("object " + og.unparse('/') + ": error reading object: " + e.what())));
        }
    }

    if (isUnresolved(og)) {
        // PDF spec says unknown objects resolve to the null object.
        QTC::TC("qpdf", "QPDF resolve failure to null");
        updateCache(og, QPDFObject::create<QPDF_Null>(), -1, -1);
    }

    auto& result(m->obj_cache[og].object);
    result->setDefaultDescription(this, og);
    return result;
}